

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

int xmlStrEqual(xmlChar *str1,xmlChar *str2)

{
  xmlChar *pxVar1;
  long lVar2;
  
  if (str1 != str2) {
    if (str2 == (xmlChar *)0x0 || str1 == (xmlChar *)0x0) {
      return 0;
    }
    lVar2 = 0;
    do {
      pxVar1 = str2 + lVar2;
      if (str1[lVar2] != *pxVar1) {
        return 0;
      }
      lVar2 = lVar2 + 1;
    } while (*pxVar1 != '\0');
  }
  return 1;
}

Assistant:

int
xmlStrEqual(const xmlChar *str1, const xmlChar *str2) {
    if (str1 == str2) return(1);
    if (str1 == NULL) return(0);
    if (str2 == NULL) return(0);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    return(strcmp((const char *)str1, (const char *)str2) == 0);
#else
    do {
        if (*str1++ != *str2) return(0);
    } while (*str2++);
    return(1);
#endif
}